

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_stdout_and_stderr_to_file_swap(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint file;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  uv_process_options_t *puVar7;
  int extraout_EDX;
  char *loop;
  uv__queue *unaff_RBP;
  int iVar8;
  undefined1 *puVar9;
  uv_handle_t *puVar10;
  uv_process_options_t *unaff_R14;
  char *req;
  uv__queue *unaff_R15;
  int64_t eval_b_4;
  int64_t eval_b_8;
  int64_t eval_b;
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  undefined1 auStackY_890 [48];
  uv_loop_t *puStackY_860;
  long lStackY_850;
  long lStackY_848;
  uv_loop_t *puStackY_840;
  uv_process_options_t *puStackY_838;
  long lStackY_828;
  long lStackY_820;
  uv_os_fd_t uStackY_814;
  uv_stdio_container_t uStackY_810;
  undefined4 uStackY_800;
  undefined4 uStackY_7f8;
  undefined4 uStackY_7f0;
  undefined4 uStackY_7e8;
  undefined4 uStackY_7e0;
  uv_os_fd_t uStackY_7d8;
  sockaddr_in sStackY_7d0;
  uv_loop_t *puStackY_7c0;
  undefined8 uStackY_7b8;
  long lStackY_7b0;
  uv_tcp_t uStackY_7a8;
  long lStackY_6d0;
  long lStackY_6c8;
  uv_stdio_container_t uStackY_6c0;
  undefined4 uStackY_6b0;
  undefined4 uStackY_6a0;
  undefined4 uStackY_690;
  uv_loop_t *puStackY_688;
  undefined1 auStackY_678 [296];
  undefined1 auStackY_550 [16];
  char acStackY_540 [32];
  uv_stdio_container_t uStackY_520;
  undefined4 uStackY_510;
  uv_loop_t *puStackY_508;
  uv_write_t uStackY_4f8;
  uv_stream_t uStackY_430;
  uv_stream_t uStackY_348;
  uv_loop_t *puStackY_260;
  uv_fs_t *puStackY_258;
  uv__queue *puStackY_250;
  uv_buf_t local_228;
  uv_rwlock_t local_218;
  uv_fs_t local_1e0;
  
  local_228.len = (size_t)local_228.base;
  loop = "stdout_file";
  puStackY_250 = (uv__queue *)0x1bc227;
  unlink("stdout_file");
  puStackY_250 = (uv__queue *)0x1bc233;
  unlink("stderr_file");
  puStackY_250 = (uv__queue *)0x1bc246;
  init_process_options("spawn_helper6",exit_cb);
  puStackY_250 = (uv__queue *)0x1bc263;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,&local_1e0,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar4 = (uint)local_1e0.result;
  local_218.__align = (long)iVar3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_228.len;
  local_228 = (uv_buf_t)(auVar2 << 0x40);
  if (local_218.__align == 0) {
    loop = (char *)(ulong)(uint)local_1e0.result;
    puStackY_250 = (uv__queue *)0x1bc290;
    uv_fs_req_cleanup(&local_1e0);
    puStackY_250 = (uv__queue *)0x1bc29c;
    uVar4 = dup2(uVar4,1);
    unaff_RBP = (uv__queue *)(ulong)uVar4;
    local_218.__align = (long)(int)uVar4;
    local_228.base = (char *)0xffffffffffffffff;
    if (local_218.__align == -1) goto LAB_001bc66f;
    puStackY_250 = (uv__queue *)0x1bc2df;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&local_1e0,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
    local_218.__align = (long)iVar3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_228.len;
    local_228 = (uv_buf_t)(auVar1 << 0x40);
    if (local_218.__align != 0) goto LAB_001bc67e;
    puStackY_250 = (uv__queue *)0x1bc30c;
    uv_fs_req_cleanup(&local_1e0);
    unaff_R15 = (uv__queue *)0x2;
    puStackY_250 = (uv__queue *)0x1bc31e;
    file = dup2((uint)local_1e0.result,2);
    loop = (char *)(ulong)file;
    local_218.__align = (long)(int)file;
    local_228.base = (char *)0xffffffffffffffff;
    if (local_218.__align == -1) goto LAB_001bc68d;
    options.stdio = (uv_stdio_container_t *)&local_218;
    unaff_R14 = &options;
    local_218.__data.__writers = (int)file >> 0x1f;
    local_218.__align = (ulong)local_218.__data.__writers << 0x20;
    local_218.__data.__pad3 = 2;
    local_218._32_4_ = 2;
    options.stdio_count = 3;
    puStackY_250 = (uv__queue *)0x1bc376;
    local_218.__data.__cur_writer = file;
    local_218.__data.__pad2._0_4_ = uVar4;
    puVar5 = uv_default_loop();
    puStackY_250 = (uv__queue *)0x1bc388;
    iVar3 = uv_spawn(puVar5,&process,&options);
    local_228.base = (char *)(long)iVar3;
    if ((char *)(long)iVar3 != (char *)0x0) goto LAB_001bc69c;
    puStackY_250 = (uv__queue *)0x1bc3ad;
    puVar5 = uv_default_loop();
    puStackY_250 = (uv__queue *)0x1bc3b7;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    local_228.base = (char *)(long)iVar3;
    if ((char *)(long)iVar3 != (char *)0x0) goto LAB_001bc6ab;
    local_228.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bc6ba;
    local_228.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bc6c9;
    puStackY_250 = (uv__queue *)0x1bc432;
    local_228 = uv_buf_init(output,0x400);
    puStackY_250 = (uv__queue *)0x1bc45d;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&local_1e0,uVar4,&local_228,1,0,(uv_fs_cb)0x0);
    req = (char *)unaff_R14;
    if (iVar3 < 0xf) goto LAB_001bc6d8;
    req = (char *)&local_1e0;
    puStackY_250 = (uv__queue *)0x1bc48a;
    uv_fs_req_cleanup((uv_fs_t *)req);
    puStackY_250 = (uv__queue *)0x1bc498;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)req,uVar4,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001bc6e7;
    puStackY_250 = (uv__queue *)0x1bc4c2;
    uv_fs_req_cleanup(&local_1e0);
    req = output;
    puStackY_250 = (uv__queue *)0x1bc4da;
    printf("output is: %s",output);
    puStackY_250 = (uv__queue *)0x1bc4ee;
    iVar3 = strncmp("hello errworld\n",output,0xf);
    if (iVar3 != 0) goto LAB_001bc6f6;
    puStackY_250 = (uv__queue *)0x1bc532;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&local_1e0,file,&local_228,1,0,(uv_fs_cb)0x0);
    if (iVar3 < 0xc) goto LAB_001bc705;
    req = (char *)&local_1e0;
    puStackY_250 = (uv__queue *)0x1bc55f;
    uv_fs_req_cleanup((uv_fs_t *)req);
    puStackY_250 = (uv__queue *)0x1bc56d;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)req,file,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001bc714;
    puStackY_250 = (uv__queue *)0x1bc597;
    uv_fs_req_cleanup(&local_1e0);
    loop = output;
    puStackY_250 = (uv__queue *)0x1bc5af;
    printf("output is: %s",output);
    puStackY_250 = (uv__queue *)0x1bc5c3;
    iVar3 = strncmp("hello world\n",output,0xc);
    if (iVar3 != 0) goto LAB_001bc723;
    puStackY_250 = (uv__queue *)0x1bc5ef;
    unlink("stdout_file");
    puStackY_250 = (uv__queue *)0x1bc5fb;
    unlink("stderr_file");
    puStackY_250 = (uv__queue *)0x1bc600;
    loop = (char *)uv_default_loop();
    puStackY_250 = (uv__queue *)0x1bc614;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStackY_250 = (uv__queue *)0x1bc61e;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStackY_250 = (uv__queue *)0x1bc62c;
    puVar5 = uv_default_loop();
    puStackY_250 = (uv__queue *)0x1bc634;
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      puStackY_250 = (uv__queue *)0x1bc650;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_250 = (uv__queue *)0x1bc66f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_001bc66f:
    puStackY_250 = (uv__queue *)0x1bc67e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_001bc67e:
    puStackY_250 = (uv__queue *)0x1bc68d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_001bc68d:
    puStackY_250 = (uv__queue *)0x1bc69c;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_001bc69c:
    puStackY_250 = (uv__queue *)0x1bc6ab;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_001bc6ab:
    puStackY_250 = (uv__queue *)0x1bc6ba;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_001bc6ba:
    puStackY_250 = (uv__queue *)0x1bc6c9;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_001bc6c9:
    puStackY_250 = (uv__queue *)0x1bc6d8;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
    req = (char *)unaff_R14;
LAB_001bc6d8:
    puStackY_250 = (uv__queue *)0x1bc6e7;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_001bc6e7:
    puStackY_250 = (uv__queue *)0x1bc6f6;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_001bc6f6:
    puStackY_250 = (uv__queue *)0x1bc705;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_001bc705:
    puStackY_250 = (uv__queue *)0x1bc714;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_001bc714:
    puStackY_250 = (uv__queue *)0x1bc723;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_001bc723:
    puStackY_250 = (uv__queue *)0x1bc732;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  puStackY_250 = (uv__queue *)run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  iVar8 = (int)auStackY_678 + 0x118;
  builtin_strncpy(acStackY_540,"hello-from-spawn_stdin",0x17);
  auStackY_678._272_8_ = (uv_async_cb)0x1bc77b;
  puStackY_260 = (uv_loop_t *)loop;
  puStackY_258 = (uv_fs_t *)req;
  puStackY_250 = unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  auStackY_678._272_8_ = (uv_async_cb)0x1bc780;
  puVar6 = uv_default_loop();
  puVar5 = (uv_loop_t *)&uStackY_348;
  auStackY_678._272_8_ = (uv_async_cb)0x1bc795;
  uv_pipe_init(puVar6,(uv_pipe_t *)puVar5,0);
  auStackY_678._272_8_ = (uv_async_cb)0x1bc79a;
  puVar6 = uv_default_loop();
  auStackY_678._272_8_ = (uv_async_cb)0x1bc7af;
  uv_pipe_init(puVar6,(uv_pipe_t *)&uStackY_430,0);
  options.stdio = &uStackY_520;
  uStackY_520.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStackY_510 = 0x21;
  options.stdio_count = 2;
  auStackY_678._272_8_ = (uv_async_cb)0x1bc7e6;
  uStackY_520.data.stream = &uStackY_430;
  puStackY_508 = puVar5;
  puVar6 = uv_default_loop();
  auStackY_678._272_8_ = (uv_async_cb)0x1bc7f8;
  iVar3 = uv_spawn(puVar6,&process,&options);
  uStackY_4f8.data = (void *)(long)iVar3;
  auStackY_550._0_8_ = (char *)0x0;
  if ((uv__queue *)uStackY_4f8.data == (uv__queue *)0x0) {
    auStackY_550._0_8_ = acStackY_540;
    auStackY_550._8_8_ = 0x17;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc84b;
    iVar3 = uv_write(&uStackY_4f8,&uStackY_430,(uv_buf_t *)auStackY_550,1,write_cb);
    auStackY_678._288_8_ = SEXT48(iVar3);
    auStackY_678._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_678._288_8_ != (uv__queue *)0x0) goto LAB_001bc9b1;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc884;
    iVar3 = uv_read_start(&uStackY_348,on_alloc,on_read);
    auStackY_678._288_8_ = SEXT48(iVar3);
    auStackY_678._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_678._288_8_ != (uv__queue *)0x0) goto LAB_001bc9be;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc8a7;
    puVar6 = uv_default_loop();
    auStackY_678._272_8_ = (uv_async_cb)0x1bc8b1;
    iVar3 = uv_run(puVar6,UV_RUN_DEFAULT);
    auStackY_678._288_8_ = SEXT48(iVar3);
    auStackY_678._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_678._288_8_ != (uv__queue *)0x0) goto LAB_001bc9cb;
    auStackY_678._288_8_ = (uv__queue *)0x1;
    auStackY_678._280_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStackY_678._280_8_ != (uv__queue *)0x1) goto LAB_001bc9d8;
    auStackY_678._288_8_ = (uv__queue *)0x3;
    auStackY_678._280_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStackY_678._280_8_ != (uv__queue *)0x3) goto LAB_001bc9e5;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc926;
    iVar3 = strcmp(acStackY_540,output);
    auStackY_678._288_8_ = SEXT48(iVar3);
    auStackY_678._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_678._288_8_ != (uv__queue *)0x0) goto LAB_001bc9f2;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc949;
    puVar5 = uv_default_loop();
    auStackY_678._272_8_ = (uv_async_cb)0x1bc95d;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    auStackY_678._272_8_ = (uv_async_cb)0x1bc967;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStackY_678._288_8_ = (uv__queue *)0x0;
    auStackY_678._272_8_ = (uv_async_cb)0x1bc975;
    puVar6 = uv_default_loop();
    auStackY_678._272_8_ = (uv_async_cb)0x1bc97d;
    iVar3 = uv_loop_close(puVar6);
    auStackY_678._280_8_ = SEXT48(iVar3);
    if (auStackY_678._288_8_ == auStackY_678._280_8_) {
      auStackY_678._272_8_ = (uv_async_cb)0x1bc993;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9b1;
    run_test_spawn_stdin_cold_1();
LAB_001bc9b1:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9be;
    run_test_spawn_stdin_cold_2();
LAB_001bc9be:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9cb;
    run_test_spawn_stdin_cold_3();
LAB_001bc9cb:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9d8;
    run_test_spawn_stdin_cold_4();
LAB_001bc9d8:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9e5;
    run_test_spawn_stdin_cold_5();
LAB_001bc9e5:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9f2;
    run_test_spawn_stdin_cold_6();
LAB_001bc9f2:
    auStackY_678._272_8_ = (uv_async_cb)0x1bc9ff;
    run_test_spawn_stdin_cold_7();
  }
  puVar9 = auStackY_678 + 0x120;
  auStackY_678._272_8_ = write_cb;
  run_test_spawn_stdin_cold_8();
  auStackY_678._272_8_ = SEXT48(iVar8);
  auStackY_678._264_8_ = 0;
  if ((uv_async_cb)auStackY_678._272_8_ == (uv_async_cb)0x0) {
    uv_close(*(uv_handle_t **)(puVar9 + 0x58),close_cb);
    return extraout_EAX;
  }
  auStackY_678._248_8_ = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  uStackY_7a8.queued_fds = (void *)0x1bca6e;
  auStackY_678._232_8_ = puVar5;
  auStackY_678._240_8_ = &uStackY_430;
  auStackY_678._248_8_ = unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  uStackY_7a8.queued_fds = (void *)0x1bca73;
  puVar5 = uv_default_loop();
  puVar7 = (uv_process_options_t *)auStackY_678;
  uStackY_7a8.queued_fds = (void *)0x1bca87;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar7,0);
  options.stdio = &uStackY_6c0;
  uStackY_6c0.flags = UV_IGNORE;
  uStackY_6b0 = 0;
  uStackY_6a0 = 0;
  uStackY_690 = 0x21;
  options.stdio_count = 4;
  uStackY_7a8.queued_fds = (void *)0x1bcabc;
  puStackY_688 = (uv_loop_t *)puVar7;
  puVar5 = uv_default_loop();
  uStackY_7a8.queued_fds = (void *)0x1bcace;
  iVar3 = uv_spawn(puVar5,&process,&options);
  lStackY_6c8 = (long)iVar3;
  lStackY_6d0 = 0;
  if (lStackY_6c8 == 0) {
    uStackY_7a8.queued_fds = (void *)0x1bcb04;
    iVar3 = uv_read_start((uv_stream_t *)auStackY_678,on_alloc,on_read);
    lStackY_6c8 = (long)iVar3;
    lStackY_6d0 = 0;
    if (lStackY_6c8 != 0) goto LAB_001bcc44;
    uStackY_7a8.queued_fds = (void *)0x1bcb27;
    puVar5 = uv_default_loop();
    uStackY_7a8.queued_fds = (void *)0x1bcb31;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStackY_6c8 = (long)iVar3;
    lStackY_6d0 = 0;
    if (lStackY_6c8 != 0) goto LAB_001bcc51;
    lStackY_6c8 = 1;
    lStackY_6d0 = (long)exit_cb_called;
    if (lStackY_6d0 != 1) goto LAB_001bcc5e;
    lStackY_6c8 = 2;
    lStackY_6d0 = (long)close_cb_called;
    if (lStackY_6d0 != 2) goto LAB_001bcc6b;
    uStackY_7a8.queued_fds = (void *)0x1bcbad;
    printf("output from stdio[3] is: %s",output);
    uStackY_7a8.queued_fds = (void *)0x1bcbbc;
    iVar3 = strcmp("fourth stdio!\n",output);
    lStackY_6c8 = (long)iVar3;
    lStackY_6d0 = 0;
    puVar7 = (uv_process_options_t *)output;
    if (lStackY_6c8 != 0) goto LAB_001bcc78;
    uStackY_7a8.queued_fds = (void *)0x1bcbdf;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    uStackY_7a8.queued_fds = (void *)0x1bcbf3;
    uv_walk((uv_loop_t *)puVar7,close_walk_cb,(void *)0x0);
    uStackY_7a8.queued_fds = (void *)0x1bcbfd;
    uv_run((uv_loop_t *)puVar7,UV_RUN_DEFAULT);
    lStackY_6c8 = 0;
    uStackY_7a8.queued_fds = (void *)0x1bcc0b;
    puVar5 = uv_default_loop();
    uStackY_7a8.queued_fds = (void *)0x1bcc13;
    iVar3 = uv_loop_close(puVar5);
    lStackY_6d0 = (long)iVar3;
    if (lStackY_6c8 == lStackY_6d0) {
      uStackY_7a8.queued_fds = (void *)0x1bcc29;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStackY_7a8.queued_fds = (void *)0x1bcc44;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_001bcc44:
    uStackY_7a8.queued_fds = (void *)0x1bcc51;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_001bcc51:
    uStackY_7a8.queued_fds = (void *)0x1bcc5e;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_001bcc5e:
    uStackY_7a8.queued_fds = (void *)0x1bcc6b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_001bcc6b:
    uStackY_7a8.queued_fds = (void *)0x1bcc78;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_001bcc78:
    uStackY_7a8.queued_fds = (void *)0x1bcc85;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStackY_7a8.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStackY_7c0 = (uv_loop_t *)0x1bcc9e;
  puVar5 = uv_default_loop();
  puStackY_7c0 = (uv_loop_t *)0x1bccab;
  iVar3 = uv_tcp_init(puVar5,&uStackY_7a8);
  lStackY_7b0 = (long)iVar3;
  uStackY_7b8 = 0;
  if (lStackY_7b0 == 0) {
    puStackY_7c0 = (uv_loop_t *)0x1bccd4;
    iVar3 = uv_tcp_open(&uStackY_7a8,3);
    lStackY_7b0 = (long)iVar3;
    uStackY_7b8 = 0;
    if (lStackY_7b0 != 0) goto LAB_001bcd33;
    puStackY_7c0 = (uv_loop_t *)0x1bccff;
    iVar3 = uv_listen((uv_stream_t *)&uStackY_7a8,0x1000,(uv_connection_cb)0x0);
    lStackY_7b0 = (long)iVar3;
    uStackY_7b8 = 0;
    if (lStackY_7b0 == 0) {
      return 1;
    }
  }
  else {
    puStackY_7c0 = (uv_loop_t *)0x1bcd33;
    spawn_tcp_server_helper_cold_1();
LAB_001bcd33:
    puStackY_7c0 = (uv_loop_t *)0x1bcd40;
    spawn_tcp_server_helper_cold_2();
  }
  puStackY_7c0 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStackY_838 = (uv_process_options_t *)0x1bcd65;
  puStackY_7c0 = (uv_loop_t *)puVar7;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  puStackY_838 = (uv_process_options_t *)0x1bcd7b;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStackY_7d0);
  uStackY_810._0_8_ = SEXT48(iVar3);
  lStackY_828 = 0;
  if (uStackY_810._0_8_ == 0) {
    puStackY_838 = (uv_process_options_t *)0x1bcda0;
    puVar5 = uv_default_loop();
    puStackY_838 = (uv_process_options_t *)0x1bcdb4;
    iVar3 = uv_tcp_init_ex(puVar5,&tcp_server,2);
    uStackY_810._0_8_ = SEXT48(iVar3);
    lStackY_828 = 0;
    if (uStackY_810._0_8_ != 0) goto LAB_001bcf99;
    puStackY_838 = (uv_process_options_t *)0x1bcde7;
    iVar3 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStackY_7d0,0);
    uStackY_810._0_8_ = SEXT48(iVar3);
    lStackY_828 = 0;
    if (uStackY_810._0_8_ != 0) goto LAB_001bcfa8;
    puStackY_838 = (uv_process_options_t *)0x1bce18;
    iVar3 = uv_fileno((uv_handle_t *)&tcp_server,&uStackY_814);
    uStackY_810._0_8_ = SEXT48(iVar3);
    lStackY_828 = 0;
    if (uStackY_810._0_8_ != 0) goto LAB_001bcfb7;
    options.stdio = &uStackY_810;
    puVar7 = &options;
    uStackY_810._4_4_ = iVar3 >> 0x1f;
    uStackY_810.flags = 2;
    uStackY_810.data.file = 0;
    uStackY_800 = 2;
    uStackY_7f8 = 1;
    uStackY_7f0 = 2;
    uStackY_7e8 = 2;
    uStackY_7e0 = 2;
    uStackY_7d8 = uStackY_814;
    options.stdio_count = 4;
    puStackY_838 = (uv_process_options_t *)0x1bce82;
    puVar5 = uv_default_loop();
    puStackY_838 = (uv_process_options_t *)0x1bce94;
    iVar3 = uv_spawn(puVar5,&process,&options);
    lStackY_828 = (long)iVar3;
    lStackY_820 = 0;
    if (lStackY_828 != 0) goto LAB_001bcfc6;
    puStackY_838 = (uv_process_options_t *)0x1bceb9;
    puVar5 = uv_default_loop();
    puStackY_838 = (uv_process_options_t *)0x1bcec3;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStackY_828 = (long)iVar3;
    lStackY_820 = 0;
    if (lStackY_828 != 0) goto LAB_001bcfd5;
    lStackY_828 = 1;
    lStackY_820 = (long)exit_cb_called;
    if (lStackY_820 != 1) goto LAB_001bcfe4;
    lStackY_828 = 1;
    lStackY_820 = (long)close_cb_called;
    if (lStackY_820 != 1) goto LAB_001bcff3;
    puStackY_838 = (uv_process_options_t *)0x1bcf32;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    puStackY_838 = (uv_process_options_t *)0x1bcf46;
    uv_walk((uv_loop_t *)puVar7,close_walk_cb,(void *)0x0);
    puStackY_838 = (uv_process_options_t *)0x1bcf50;
    uv_run((uv_loop_t *)puVar7,UV_RUN_DEFAULT);
    lStackY_828 = 0;
    puStackY_838 = (uv_process_options_t *)0x1bcf5e;
    puVar5 = uv_default_loop();
    puStackY_838 = (uv_process_options_t *)0x1bcf66;
    iVar3 = uv_loop_close(puVar5);
    lStackY_820 = (long)iVar3;
    if (lStackY_828 == lStackY_820) {
      puStackY_838 = (uv_process_options_t *)0x1bcf82;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_838 = (uv_process_options_t *)0x1bcf99;
    run_test_spawn_tcp_server_cold_1();
LAB_001bcf99:
    puStackY_838 = (uv_process_options_t *)0x1bcfa8;
    run_test_spawn_tcp_server_cold_2();
LAB_001bcfa8:
    puStackY_838 = (uv_process_options_t *)0x1bcfb7;
    run_test_spawn_tcp_server_cold_3();
LAB_001bcfb7:
    puStackY_838 = (uv_process_options_t *)0x1bcfc6;
    run_test_spawn_tcp_server_cold_4();
LAB_001bcfc6:
    puStackY_838 = (uv_process_options_t *)0x1bcfd5;
    run_test_spawn_tcp_server_cold_5();
LAB_001bcfd5:
    puStackY_838 = (uv_process_options_t *)0x1bcfe4;
    run_test_spawn_tcp_server_cold_6();
LAB_001bcfe4:
    puStackY_838 = (uv_process_options_t *)0x1bcff3;
    run_test_spawn_tcp_server_cold_7();
LAB_001bcff3:
    puStackY_838 = (uv_process_options_t *)0x1bd002;
    run_test_spawn_tcp_server_cold_8();
  }
  puStackY_838 = (uv_process_options_t *)run_test_spawn_ignored_stdio;
  run_test_spawn_tcp_server_cold_9();
  puStackY_838 = &options;
  puStackY_860 = (uv_loop_t *)0x1bd02b;
  puStackY_840 = (uv_loop_t *)puVar7;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar7 = &options;
  options.stdio_count = 0;
  puStackY_860 = (uv_loop_t *)0x1bd04b;
  puVar5 = uv_default_loop();
  puStackY_860 = (uv_loop_t *)0x1bd05d;
  iVar3 = uv_spawn(puVar5,&process,&options);
  lStackY_848 = (long)iVar3;
  lStackY_850 = 0;
  if (lStackY_848 == 0) {
    puStackY_860 = (uv_loop_t *)0x1bd07e;
    puVar5 = uv_default_loop();
    puStackY_860 = (uv_loop_t *)0x1bd088;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStackY_848 = (long)iVar3;
    lStackY_850 = 0;
    if (lStackY_848 != 0) goto LAB_001bd15c;
    lStackY_848 = 1;
    lStackY_850 = (long)exit_cb_called;
    if (lStackY_850 != 1) goto LAB_001bd16b;
    lStackY_848 = 1;
    lStackY_850 = (long)close_cb_called;
    if (lStackY_850 != 1) goto LAB_001bd17a;
    puStackY_860 = (uv_loop_t *)0x1bd0f7;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    puStackY_860 = (uv_loop_t *)0x1bd10b;
    uv_walk((uv_loop_t *)puVar7,close_walk_cb,(void *)0x0);
    puStackY_860 = (uv_loop_t *)0x1bd115;
    uv_run((uv_loop_t *)puVar7,UV_RUN_DEFAULT);
    lStackY_848 = 0;
    puStackY_860 = (uv_loop_t *)0x1bd123;
    puVar5 = uv_default_loop();
    puStackY_860 = (uv_loop_t *)0x1bd12b;
    iVar3 = uv_loop_close(puVar5);
    lStackY_850 = (long)iVar3;
    if (lStackY_848 == lStackY_850) {
      puStackY_860 = (uv_loop_t *)0x1bd143;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_860 = (uv_loop_t *)0x1bd15c;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001bd15c:
    puStackY_860 = (uv_loop_t *)0x1bd16b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001bd16b:
    puStackY_860 = (uv_loop_t *)0x1bd17a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001bd17a:
    puStackY_860 = (uv_loop_t *)0x1bd189;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStackY_860 = (uv_loop_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  puVar9 = auStackY_890 + 0x20;
  auStackY_890._24_8_ = (uv_close_cb)0x1bd1b0;
  puStackY_860 = (uv_loop_t *)puVar7;
  init_process_options("spawn_helper4",kill_cb);
  auStackY_890._24_8_ = (uv_close_cb)0x1bd1b5;
  puVar5 = uv_default_loop();
  auStackY_890._24_8_ = (uv_close_cb)0x1bd1cb;
  iVar3 = uv_spawn(puVar5,&process,&options);
  auStackY_890._40_8_ = SEXT48(iVar3);
  auStackY_890._32_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStackY_890._40_8_ == (uv__queue *)0x0) {
    auStackY_890._24_8_ = (uv_close_cb)0x1bd1ee;
    puVar5 = uv_default_loop();
    auStackY_890._24_8_ = (uv_close_cb)0x1bd1fd;
    iVar3 = uv_timer_init(puVar5,&timer);
    auStackY_890._40_8_ = SEXT48(iVar3);
    auStackY_890._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_890._40_8_ != (uv__queue *)0x0) goto LAB_001bd32a;
    auStackY_890._24_8_ = (uv_close_cb)0x1bd235;
    iVar3 = uv_timer_start(&timer,timer_cb,500,0);
    auStackY_890._40_8_ = SEXT48(iVar3);
    auStackY_890._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_890._40_8_ != (uv__queue *)0x0) goto LAB_001bd337;
    auStackY_890._24_8_ = (uv_close_cb)0x1bd258;
    puVar5 = uv_default_loop();
    auStackY_890._24_8_ = (uv_close_cb)0x1bd262;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    auStackY_890._40_8_ = SEXT48(iVar3);
    auStackY_890._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_890._40_8_ != (uv__queue *)0x0) goto LAB_001bd344;
    auStackY_890._40_8_ = (uv__queue *)0x1;
    auStackY_890._32_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStackY_890._32_8_ != (uv__queue *)0x1) goto LAB_001bd351;
    auStackY_890._40_8_ = (uv__queue *)0x2;
    auStackY_890._32_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStackY_890._32_8_ != (uv__queue *)0x2) goto LAB_001bd35e;
    auStackY_890._24_8_ = (uv_close_cb)0x1bd2cb;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    auStackY_890._24_8_ = (uv_close_cb)0x1bd2df;
    uv_walk((uv_loop_t *)puVar7,close_walk_cb,(void *)0x0);
    auStackY_890._24_8_ = (uv_close_cb)0x1bd2e9;
    uv_run((uv_loop_t *)puVar7,UV_RUN_DEFAULT);
    auStackY_890._40_8_ = (uv__queue *)0x0;
    auStackY_890._24_8_ = (uv_close_cb)0x1bd2f7;
    puVar5 = uv_default_loop();
    auStackY_890._24_8_ = (uv_close_cb)0x1bd2ff;
    iVar3 = uv_loop_close(puVar5);
    auStackY_890._32_8_ = SEXT48(iVar3);
    if (auStackY_890._40_8_ == auStackY_890._32_8_) {
      auStackY_890._24_8_ = (uv_close_cb)0x1bd315;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStackY_890._24_8_ = (uv_close_cb)0x1bd32a;
    run_test_spawn_and_kill_cold_1();
LAB_001bd32a:
    auStackY_890._24_8_ = (uv_close_cb)0x1bd337;
    run_test_spawn_and_kill_cold_2();
LAB_001bd337:
    auStackY_890._24_8_ = (uv_close_cb)0x1bd344;
    run_test_spawn_and_kill_cold_3();
LAB_001bd344:
    auStackY_890._24_8_ = (uv_close_cb)0x1bd351;
    run_test_spawn_and_kill_cold_4();
LAB_001bd351:
    auStackY_890._24_8_ = (uv_close_cb)0x1bd35e;
    run_test_spawn_and_kill_cold_5();
LAB_001bd35e:
    auStackY_890._24_8_ = (uv_close_cb)0x1bd36b;
    run_test_spawn_and_kill_cold_6();
  }
  puVar10 = (uv_handle_t *)(auStackY_890 + 0x28);
  auStackY_890._24_8_ = kill_cb;
  run_test_spawn_and_kill_cold_7();
  auStackY_890._24_8_ = (uv_close_cb)0x0;
  auStackY_890._16_8_ = 0;
  auStackY_890._8_8_ = puVar7;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  auStackY_890._0_8_ = puVar9;
  if (puVar9 == (undefined1 *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001bd419;
    uv_close(puVar10,close_cb);
    auStackY_890._0_8_ = SEXT48(*(int *)&puVar10[1].loop);
    if ((undefined1 *)auStackY_890._0_8_ != (undefined1 *)0x0) {
      iVar3 = uv_kill(*(int *)&puVar10[1].loop,0);
      auStackY_890._0_8_ = SEXT48(iVar3);
      if ((undefined1 *)auStackY_890._0_8_ == (undefined1 *)0xfffffffffffffffd) {
        return iVar3;
      }
      goto LAB_001bd42b;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001bd419:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001bd42b:
  puVar10 = (uv_handle_t *)auStackY_890;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close(puVar10,close_cb);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file_swap) {
#ifndef _WIN32
  int r;
  uv_os_fd_t stdout_file;
  uv_os_fd_t stderr_file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");
  unlink("stderr_file");

  init_process_options("spawn_helper6", exit_cb);

  /* open 'stdout_file' and replace STDOUT_FILENO with it */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT_OK(r);
  stdout_file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);
  stdout_file = dup2(stdout_file, STDOUT_FILENO);
  ASSERT_NE(stdout_file, -1);

  /* open 'stderr_file' and replace STDERR_FILENO with it */
  r = uv_fs_open(NULL, &fs_req, "stderr_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT_OK(r);
  stderr_file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);
  stderr_file = dup2(stderr_file, STDERR_FILENO);
  ASSERT_NE(stderr_file, -1);

  /* now we're going to swap them: the child process' stdout will be our
   * stderr_file and vice versa */
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = stderr_file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = stdout_file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));

  /* check the content of stdout_file */
  r = uv_fs_read(NULL, &fs_req, stdout_file, &buf, 1, 0, NULL);
  ASSERT_GE(r, 15);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stdout_file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strncmp("hello errworld\n", output, 15));

  /* check the content of stderr_file */
  r = uv_fs_read(NULL, &fs_req, stderr_file, &buf, 1, 0, NULL);
  ASSERT_GE(r, 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stderr_file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strncmp("hello world\n", output, 12));

  /* Cleanup. */
  unlink("stdout_file");
  unlink("stderr_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}